

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExternUdpDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::ExternUdpDeclSyntax_const&>
          (BumpAllocator *this,ExternUdpDeclSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ExternUdpDeclSyntax *pEVar13;
  
  pEVar13 = (ExternUdpDeclSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExternUdpDeclSyntax *)this->endPtr < pEVar13 + 1) {
    pEVar13 = (ExternUdpDeclSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(pEVar13 + 1);
  }
  (pEVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pEVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pEVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a4d30;
  uVar6 = (args->externKeyword).field_0x2;
  NVar7.raw = (args->externKeyword).numFlags.raw;
  uVar8 = (args->externKeyword).rawLen;
  pIVar3 = (args->externKeyword).info;
  (pEVar13->externKeyword).kind = (args->externKeyword).kind;
  (pEVar13->externKeyword).field_0x2 = uVar6;
  (pEVar13->externKeyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->externKeyword).rawLen = uVar8;
  (pEVar13->externKeyword).info = pIVar3;
  uVar5 = *(undefined4 *)&(args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar13->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar13->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar5;
  (pEVar13->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar13->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar13->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pEVar13->actualAttributes).super_SyntaxListBase.childCount =
       (args->actualAttributes).super_SyntaxListBase.childCount;
  sVar2 = (args->actualAttributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar13->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->actualAttributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar13->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar13->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a4d30;
  uVar6 = (args->primitive).field_0x2;
  NVar7.raw = (args->primitive).numFlags.raw;
  uVar8 = (args->primitive).rawLen;
  pIVar3 = (args->primitive).info;
  TVar9 = (args->name).kind;
  uVar10 = (args->name).field_0x2;
  NVar11.raw = (args->name).numFlags.raw;
  uVar12 = (args->name).rawLen;
  pIVar4 = (args->name).info;
  (pEVar13->primitive).kind = (args->primitive).kind;
  (pEVar13->primitive).field_0x2 = uVar6;
  (pEVar13->primitive).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->primitive).rawLen = uVar8;
  (pEVar13->primitive).info = pIVar3;
  (pEVar13->name).kind = TVar9;
  (pEVar13->name).field_0x2 = uVar10;
  (pEVar13->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pEVar13->name).rawLen = uVar12;
  (pEVar13->name).info = pIVar4;
  (pEVar13->portList).ptr = (args->portList).ptr;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }